

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O2

Mat * bgr_to_grey(Mat *bgr)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int x;
  ulong uVar4;
  long in_RSI;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = **(uint **)(in_RSI + 0x40);
  uVar2 = (*(uint **)(in_RSI + 0x40))[1];
  uVar7 = 0;
  cv::Mat::Mat(bgr,uVar1,uVar2,0);
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar7;
  }
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar7;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    lVar3 = 1;
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      lVar5 = **(long **)(in_RSI + 0x48) * uVar7 + *(long *)(in_RSI + 0x10);
      *(char *)(uVar4 + **(long **)(bgr + 0x48) * uVar7 + *(long *)(bgr + 0x10)) =
           (char)(int)((double)*(byte *)(lVar3 + lVar5) * 0.333) +
           (char)(int)((double)*(byte *)(lVar3 + 1 + lVar5) * 0.333) +
           (char)(int)((double)*(byte *)(lVar3 + -1 + lVar5) * 0.333);
      lVar3 = lVar3 + 3;
    }
  }
  return bgr;
}

Assistant:

Mat
bgr_to_grey(const Mat& bgr)
{
    int width = bgr.size().width;
    int height = bgr.size().height;
    Mat grey(height, width, 0);

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            uchar r = 0.333 * bgr.at<Vec3b>(y, x)[2];
            uchar g = 0.333 * bgr.at<Vec3b>(y, x)[1];
            uchar b = 0.333 * bgr.at<Vec3b>(y, x)[0];
            grey.at<uchar>(y, x) = uchar(r + g + b);
        }
    }

    return grey;
}